

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  bool bVar1;
  int iVar2;
  string *element_name;
  char *pcVar3;
  ostream *poVar4;
  TestInfo *this;
  TestCase *in_RSI;
  TestCase *in_RDI;
  int i;
  TestInfo *in_stack_00000140;
  char *in_stack_00000148;
  ostream *in_stack_00000150;
  string kTestsuite;
  TestInfo *in_stack_fffffffffffffcc8;
  TestCase *in_stack_fffffffffffffcd0;
  int *in_stack_fffffffffffffce8;
  TestResult *result;
  TestCase *pTVar5;
  string *name;
  allocator *stream_00;
  int local_244;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  TimeInMillis in_stack_fffffffffffffe58;
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  int local_134;
  string local_130 [39];
  allocator local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [32];
  TestCase *local_10;
  TestCase *local_8;
  
  stream_00 = &local_31;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuite",stream_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  element_name = (string *)std::operator<<((ostream *)local_8,"  <");
  std::operator<<((ostream *)element_name,local_30);
  name = (string *)local_69;
  pTVar5 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"name",(allocator *)name);
  pcVar3 = TestCase::name((TestCase *)0x1a378c);
  result = (TestResult *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),pcVar3,(allocator *)result);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"tests",&local_b9);
  local_e4 = TestCase::reportable_test_count((TestCase *)0x1a3875);
  StreamableToString<int>(in_stack_fffffffffffffce8);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"failures",&local_109);
  local_134 = TestCase::failed_test_count((TestCase *)0x1a3941);
  StreamableToString<int>(in_stack_fffffffffffffce8);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"disabled",&local_159);
  TestCase::reportable_disabled_test_count((TestCase *)0x1a3a0d);
  StreamableToString<int>(in_stack_fffffffffffffce8);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe58,"errors",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"0",&local_1d1);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"time",&local_1f9);
  TestCase::elapsed_time(local_10);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffe58);
  OutputXmlAttribute((ostream *)stream_00,element_name,name,(string *)pTVar5);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  pTVar5 = local_8;
  TestCase::ad_hoc_test_result(local_10);
  TestPropertiesAsXmlAttributes_abi_cxx11_(result);
  poVar4 = std::operator<<((ostream *)pTVar5,local_240);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_240);
  for (local_244 = 0; iVar2 = TestCase::total_test_count((TestCase *)0x1a3c8c), local_244 < iVar2;
      local_244 = local_244 + 1) {
    this = TestCase::GetTestInfo
                     (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    iVar2 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    if (bVar1) {
      in_stack_fffffffffffffcd0 = local_8;
      TestCase::name((TestCase *)0x1a3cec);
      in_stack_fffffffffffffcc8 = TestCase::GetTestInfo(in_stack_fffffffffffffcd0,iVar2);
      OutputXmlTestInfo(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    }
  }
  poVar4 = std::operator<<((ostream *)local_8,"  </");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "failures",
                     StreamableToString(test_case.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuite, "disabled",
      StreamableToString(test_case.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "errors", "0");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
  *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result())
          << ">\n";

  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}